

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int kwsysProcessGetTimeoutTime(cmsysProcess *cp,double *userTimeout,kwsysProcessTime *timeoutTime)

{
  int iVar1;
  kwsysProcessTime kVar2;
  kwsysProcessTime in2;
  long local_78;
  kwsysProcessTime userTimeoutTime;
  kwsysProcessTime userTimeoutLength;
  kwsysProcessTime currentTime;
  long local_40;
  kwsysProcessTime length;
  kwsysProcessTime *timeoutTime_local;
  double *userTimeout_local;
  cmsysProcess *cp_local;
  
  if ((0.0 < cp->Timeout) && ((cp->TimeoutTime).tv_sec < 0)) {
    kVar2 = kwsysProcessTimeFromDouble(cp->Timeout);
    kVar2 = kwsysProcessTimeAdd(cp->StartTime,kVar2);
    currentTime.tv_usec = kVar2.tv_sec;
    (cp->TimeoutTime).tv_sec = currentTime.tv_usec;
    local_40 = kVar2.tv_usec;
    (cp->TimeoutTime).tv_usec = local_40;
  }
  timeoutTime->tv_sec = (cp->TimeoutTime).tv_sec;
  timeoutTime->tv_usec = (cp->TimeoutTime).tv_usec;
  if (userTimeout != (double *)0x0) {
    kVar2 = kwsysProcessTimeGetCurrent();
    in2 = kwsysProcessTimeFromDouble(*userTimeout);
    kVar2 = kwsysProcessTimeAdd(kVar2,in2);
    if ((timeoutTime->tv_sec < 0) || (iVar1 = kwsysProcessTimeLess(kVar2,*timeoutTime), iVar1 != 0))
    {
      local_78 = kVar2.tv_sec;
      timeoutTime->tv_sec = local_78;
      userTimeoutTime.tv_sec = kVar2.tv_usec;
      timeoutTime->tv_usec = userTimeoutTime.tv_sec;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int kwsysProcessGetTimeoutTime(kwsysProcess* cp, double* userTimeout,
                                      kwsysProcessTime* timeoutTime)
{
  /* The first time this is called, we need to calculate the time at
     which the child will timeout.  */
  if(cp->Timeout > 0 && cp->TimeoutTime.tv_sec < 0)
    {
    kwsysProcessTime length = kwsysProcessTimeFromDouble(cp->Timeout);
    cp->TimeoutTime = kwsysProcessTimeAdd(cp->StartTime, length);
    }

  /* Start with process timeout.  */
  *timeoutTime = cp->TimeoutTime;

  /* Check if the user timeout is earlier.  */
  if(userTimeout)
    {
    kwsysProcessTime currentTime = kwsysProcessTimeGetCurrent();
    kwsysProcessTime userTimeoutLength = kwsysProcessTimeFromDouble(*userTimeout);
    kwsysProcessTime userTimeoutTime = kwsysProcessTimeAdd(currentTime,
                                                           userTimeoutLength);
    if(timeoutTime->tv_sec < 0 ||
       kwsysProcessTimeLess(userTimeoutTime, *timeoutTime))
      {
      *timeoutTime = userTimeoutTime;
      return 1;
      }
    }
  return 0;
}